

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.upb.h
# Opt level: O2

upb_test_Proto2EnumMessage *
upb_test_Proto2EnumMessage_parse(char *buf,size_t size,upb_Arena *arena)

{
  upb_DecodeStatus uVar1;
  upb_test_Proto2EnumMessage *msg;
  
  msg = upb_test_Proto2EnumMessage_new(arena);
  if (msg == (upb_test_Proto2EnumMessage *)0x0) {
    msg = (upb_test_Proto2EnumMessage *)0x0;
  }
  else {
    uVar1 = upb_Decode(buf,size,&msg->base_dont_copy_me__upb_internal_use_only,
                       &upb_0test__Proto2EnumMessage_msg_init,(upb_ExtensionRegistry *)0x0,0,arena);
    if (uVar1 != kUpb_DecodeStatus_Ok) {
      msg = (upb_test_Proto2EnumMessage *)0x0;
    }
  }
  return msg;
}

Assistant:

UPB_INLINE upb_test_Proto2EnumMessage* upb_test_Proto2EnumMessage_parse(const char* buf, size_t size, upb_Arena* arena) {
  upb_test_Proto2EnumMessage* ret = upb_test_Proto2EnumMessage_new(arena);
  if (!ret) return NULL;
  if (upb_Decode(buf, size, UPB_UPCAST(ret), &upb_0test__Proto2EnumMessage_msg_init, NULL, 0, arena) !=
      kUpb_DecodeStatus_Ok) {
    return NULL;
  }
  return ret;
}